

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_hrefk(ASMState *as,IRIns *ir)

{
  byte bVar1;
  MCode *pMVar2;
  int ofs_00;
  Reg RVar3;
  Reg r2;
  IRIns *pIVar4;
  IRIns u64;
  long in_RSI;
  ASMState *in_RDI;
  Reg key;
  Reg node;
  Reg dest;
  int32_t ofs;
  IRIns *irkey;
  IRIns *kslot;
  RegSet in_stack_ffffffffffffffa8;
  RegSet in_stack_ffffffffffffffac;
  ASMState *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int cc;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar5;
  
  cc = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  pIVar4 = in_RDI->ir + in_RDI->ir[*(ushort *)(in_RSI + 2)].field_0.op1;
  ofs_00 = (uint)in_RDI->ir[*(ushort *)(in_RSI + 2)].field_0.op2 * 0x18;
  if (((*(byte *)(in_RSI + 6) & 0x80) == 0) || (*(char *)(in_RSI + 7) != '\0')) {
    RVar3 = ra_dest(in_stack_ffffffffffffffb0,
                    (IRIns *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
  }
  else {
    RVar3 = 0x80;
  }
  uVar5 = RVar3;
  r2 = ra_alloc1(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  if ((RVar3 & 0x80) == 0) {
    if (ofs_00 == 0) {
      if (RVar3 != r2) {
        emit_rr(in_RDI,XO_MOV,RVar3,r2);
      }
    }
    else if (RVar3 == r2) {
      emit_gri(in_RDI,0x838100,RVar3,ofs_00);
    }
    else {
      emit_rmro(in_RDI,XO_LEA,RVar3,r2,ofs_00);
    }
  }
  asm_guardcc((ASMState *)CONCAT44(uVar5,in_stack_ffffffffffffffc0),cc);
  if (((pIVar4->field_1).t.irt & 0x1f) < 3) {
    bVar1 = (pIVar4->field_1).t.irt;
    pMVar2 = in_RDI->mcp;
    in_RDI->mcp = pMVar2 + -1;
    pMVar2[-1] = bVar1 & 0x1f ^ 0xff;
    emit_rmro(in_RDI,XO_ARITHi8,7,r2,ofs_00 + 0xc);
  }
  else {
    RVar3 = ra_scratch(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    emit_rmro(in_RDI,XO_CMP,RVar3 | 0x80200,r2,ofs_00 + 8);
    if (((pIVar4->field_1).t.irt & 0x1f) == 0xe) {
      u64 = pIVar4[1];
    }
    else {
      u64 = (IRIns)((ulong)*(uint5 *)pIVar4 & 0x1fffffffff ^ 0xffffffff00000000);
    }
    emit_loadu64((ASMState *)CONCAT44(uVar5,RVar3),(Reg)((ulong)in_RDI >> 0x20),(uint64_t)u64);
  }
  return;
}

Assistant:

static void asm_hrefk(ASMState *as, IRIns *ir)
{
  IRIns *kslot = IR(ir->op2);
  IRIns *irkey = IR(kslot->op1);
  int32_t ofs = (int32_t)(kslot->op2 * sizeof(Node));
  Reg dest = ra_used(ir) ? ra_dest(as, ir, RSET_GPR) : RID_NONE;
  Reg node = ra_alloc1(as, ir->op1, RSET_GPR);
#if !LJ_64
  MCLabel l_exit;
#endif
  lj_assertA(ofs % sizeof(Node) == 0, "unaligned HREFK slot");
  if (ra_hasreg(dest)) {
    if (ofs != 0) {
      if (dest == node)
	emit_gri(as, XG_ARITHi(XOg_ADD), dest|REX_GC64, ofs);
      else
	emit_rmro(as, XO_LEA, dest|REX_GC64, node, ofs);
    } else if (dest != node) {
      emit_rr(as, XO_MOV, dest|REX_GC64, node);
    }
  }
  asm_guardcc(as, CC_NE);
#if LJ_64
  if (!irt_ispri(irkey->t)) {
    Reg key = ra_scratch(as, rset_exclude(RSET_GPR, node));
    emit_rmro(as, XO_CMP, key|REX_64, node,
	       ofs + (int32_t)offsetof(Node, key.u64));
    lj_assertA(irt_isnum(irkey->t) || irt_isgcv(irkey->t),
	       "bad HREFK key type");
    /* Assumes -0.0 is already canonicalized to +0.0. */
    emit_loadu64(as, key, irt_isnum(irkey->t) ? ir_knum(irkey)->u64 :
#if LJ_GC64
			  ((uint64_t)irt_toitype(irkey->t) << 47) |
			  (uint64_t)ir_kgc(irkey));
#else
			  ((uint64_t)irt_toitype(irkey->t) << 32) |
			  (uint64_t)(uint32_t)ptr2addr(ir_kgc(irkey)));
#endif
  } else {
    lj_assertA(!irt_isnil(irkey->t), "bad HREFK key type");
#if LJ_GC64
    emit_i32(as, (irt_toitype(irkey->t)<<15)|0x7fff);
    emit_rmro(as, XO_ARITHi, XOg_CMP, node,
	      ofs + (int32_t)offsetof(Node, key.it));
#else
    emit_i8(as, irt_toitype(irkey->t));
    emit_rmro(as, XO_ARITHi8, XOg_CMP, node,
	      ofs + (int32_t)offsetof(Node, key.it));
#endif
  }
#else
  l_exit = emit_label(as);
  if (irt_isnum(irkey->t)) {
    /* Assumes -0.0 is already canonicalized to +0.0. */
    emit_gmroi(as, XG_ARITHi(XOg_CMP), node,
	       ofs + (int32_t)offsetof(Node, key.u32.lo),
	       (int32_t)ir_knum(irkey)->u32.lo);
    emit_sjcc(as, CC_NE, l_exit);
    emit_gmroi(as, XG_ARITHi(XOg_CMP), node,
	       ofs + (int32_t)offsetof(Node, key.u32.hi),
	       (int32_t)ir_knum(irkey)->u32.hi);
  } else {
    if (!irt_ispri(irkey->t)) {
      lj_assertA(irt_isgcv(irkey->t), "bad HREFK key type");
      emit_gmroi(as, XG_ARITHi(XOg_CMP), node,
		 ofs + (int32_t)offsetof(Node, key.gcr),
		 ptr2addr(ir_kgc(irkey)));
      emit_sjcc(as, CC_NE, l_exit);
    }
    lj_assertA(!irt_isnil(irkey->t), "bad HREFK key type");
    emit_i8(as, irt_toitype(irkey->t));
    emit_rmro(as, XO_ARITHi8, XOg_CMP, node,
	      ofs + (int32_t)offsetof(Node, key.it));
  }
#endif
}